

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngram_model_set.c
# Opt level: O2

ngram_model_t * ngram_model_set_lookup(ngram_model_t *base,char *name)

{
  uint uVar1;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  
  if (name == (char *)0x0) {
    uVar4 = (ulong)*(int *)&base[1].field_0x4;
    if (uVar4 != 0xffffffffffffffff) goto LAB_0012bda2;
  }
  else {
    uVar1 = base[1].refcount;
    uVar3 = 0;
    uVar4 = 0;
    if (0 < (int)uVar1) {
      uVar4 = (ulong)uVar1;
    }
    for (; uVar4 != uVar3; uVar3 = uVar3 + 1) {
      iVar2 = strcmp(*(char **)(*(long *)&base[1].n_1g_alloc + uVar3 * 8),name);
      if (iVar2 == 0) {
        uVar4 = uVar3 & 0xffffffff;
        break;
      }
    }
    if ((uint)uVar4 != uVar1) {
LAB_0012bda2:
      return *(ngram_model_t **)(base[1].n_counts + uVar4 * 2);
    }
  }
  return (ngram_model_t *)0x0;
}

Assistant:

ngram_model_t *
ngram_model_set_lookup(ngram_model_t * base, const char *name)
{
    ngram_model_set_t *set = (ngram_model_set_t *) base;
    int32 i;

    if (name == NULL) {
        if (set->cur == -1)
            return NULL;
        else
            return set->lms[set->cur];
    }

    /* There probably won't be very many submodels. */
    for (i = 0; i < set->n_models; ++i)
        if (0 == strcmp(set->names[i], name))
            break;
    if (i == set->n_models)
        return NULL;
    return set->lms[i];
}